

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xpath_lang(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
              lyxp_set *set,int options)

{
  lyxp_set_attrs *plVar1;
  int iVar2;
  lyd_node *root;
  lyd_attr *plVar3;
  __int32_t **pp_Var4;
  char *pcVar5;
  char cVar6;
  long lVar7;
  lys_ext_instance_complex *plVar8;
  
  iVar2 = lyxp_set_cast(*args,LYXP_SET_STRING,cur_node,param_4,options);
  if (iVar2 != 0) {
    return -1;
  }
  switch(set->type) {
  case LYXP_SET_EMPTY:
switchD_00170545_caseD_0:
    goto LAB_00170670;
  case LYXP_SET_NODE_SET:
    plVar1 = (set->val).attrs;
    if (plVar1->type - LYXP_NODE_ELEM < 2) {
      plVar3 = plVar1->attr;
joined_r0x001705cc:
      for (; plVar3 != (lyd_attr *)0x0; plVar3 = (lyd_attr *)(plVar3->value).enm) {
        for (plVar8 = plVar3->annotation; plVar8 != (lys_ext_instance_complex *)0x0;
            plVar8 = (lys_ext_instance_complex *)plVar8->parent) {
          if (((*(char **)&plVar8->flags != (char *)0x0) &&
              (iVar2 = strcmp(*(char **)&plVar8->flags,"lang"), iVar2 == 0)) &&
             (iVar2 = strcmp(((lys_ext_instance_complex *)plVar8->arg_value)->module->name,"xml"),
             iVar2 == 0)) goto LAB_00170621;
        }
      }
      plVar8 = (lys_ext_instance_complex *)0x0;
LAB_00170621:
      if (plVar8 == (lys_ext_instance_complex *)0x0) goto switchD_00170545_caseD_0;
      pcVar5 = ((*args)->val).str;
      cVar6 = *pcVar5;
      if (cVar6 == '\0') {
        lVar7 = 0;
      }
      else {
        pp_Var4 = __ctype_tolower_loc();
        lVar7 = 0;
        do {
          if ((*pp_Var4)[cVar6] != (*pp_Var4)[*(char *)((long)plVar8->ext + lVar7)]) {
            set_fill_boolean(set,0);
            break;
          }
          cVar6 = pcVar5[lVar7 + 1];
          lVar7 = lVar7 + 1;
        } while (cVar6 != '\0');
      }
      if (*(char *)((long)&(((*args)->val).nodes)->node + lVar7) != '\0') {
        return 0;
      }
      cVar6 = *(char *)((long)plVar8->ext + lVar7);
      if ((cVar6 == '-') || (cVar6 == '\0')) {
        iVar2 = 1;
        goto LAB_00170672;
      }
    }
    else if (plVar1->type == LYXP_NODE_ATTR) {
      root = moveto_get_root(cur_node,options,(lyxp_node_type *)0x0);
      plVar3 = (lyd_attr *)lyd_attr_parent(root,plVar1->attr);
      goto joined_r0x001705cc;
    }
LAB_00170670:
    iVar2 = 0;
LAB_00170672:
    set_fill_boolean(set,iVar2);
    return 0;
  case LYXP_SET_SNODE_SET:
    pcVar5 = "schema node set";
    break;
  case LYXP_SET_BOOLEAN:
    pcVar5 = "boolean";
    break;
  case LYXP_SET_NUMBER:
    pcVar5 = "number";
    break;
  case LYXP_SET_STRING:
    pcVar5 = "string";
    break;
  default:
    pcVar5 = (char *)0x0;
  }
  ly_vlog(LYE_XPATH_INCTX,LY_VLOG_NONE,(void *)0x0,pcVar5,"lang(string)");
  return -1;
}

Assistant:

static int
xpath_lang(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
           struct lyxp_set *set, int options)
{
    const struct lyd_node *node, *root;
    struct lyd_attr *attr = NULL;
    int i;

    if (lyxp_set_cast(args[0], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    if (set->type == LYXP_SET_EMPTY) {
        set_fill_boolean(set, 0);
        return EXIT_SUCCESS;
    }
    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(LYE_XPATH_INCTX, LY_VLOG_NONE, NULL, print_set_type(set), "lang(string)");
        return -1;
    }

    switch (set->val.nodes[0].type) {
    case LYXP_NODE_ELEM:
    case LYXP_NODE_TEXT:
        node = set->val.nodes[0].node;
        break;
    case LYXP_NODE_ATTR:
        root = moveto_get_root(cur_node, options, NULL);
        node = lyd_attr_parent(root, set->val.attrs[0].attr);
        break;
    default:
        /* nothing to do with roots */
        set_fill_boolean(set, 0);
        return EXIT_SUCCESS;
    }

    /* find lang attribute */
    for (; node; node = node->parent) {
        for (attr = node->attr; attr; attr = attr->next) {
            if (attr->name && !strcmp(attr->name, "lang") && !strcmp(attr->annotation->module->name, "xml")) {
                break;
            }
        }

        if (attr) {
            break;
        }
    }

    /* compare languages */
    if (!attr) {
        set_fill_boolean(set, 0);
    } else {
        for (i = 0; args[0]->val.str[i]; ++i) {
            if (tolower(args[0]->val.str[i]) != tolower(attr->value_str[i])) {
                set_fill_boolean(set, 0);
                break;
            }
        }
        if (!args[0]->val.str[i]) {
            if (!attr->value_str[i] || (attr->value_str[i] == '-')) {
                set_fill_boolean(set, 1);
            } else {
                set_fill_boolean(set, 0);
            }
        }
    }

    return EXIT_SUCCESS;
}